

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

void xmlFreeTextWriterStackEntry(xmlLinkPtr lk)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)xmlLinkGetData(lk);
  if (puVar1 != (undefined8 *)0x0) {
    if ((void *)*puVar1 != (void *)0x0) {
      (*xmlFree)((void *)*puVar1);
    }
    (*xmlFree)(puVar1);
    return;
  }
  return;
}

Assistant:

static void
xmlFreeTextWriterStackEntry(xmlLinkPtr lk)
{
    xmlTextWriterStackEntry *p;

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p == 0)
        return;

    if (p->name != 0)
        xmlFree(p->name);
    xmlFree(p);
}